

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

int __thiscall basist::ktx2_transcoder::init(ktx2_transcoder *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  key_value *pkVar6;
  bool bVar7;
  uint32_t uVar8;
  int iVar9;
  ktx2_df_channel_id kVar10;
  uint8_t *puVar11;
  uint in_EDX;
  ulong uVar12;
  long lVar13;
  int *__src;
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  
  clear(this);
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x4105,"bool basist::ktx2_transcoder::init(const void *, uint32_t)");
  }
  if ((0x50 < in_EDX) && (*(int *)(ctx + 8) == 0xa1a0a0d && *(long *)ctx == -0x44cfcddfa7abb455)) {
    this->m_pData = (uint8_t *)ctx;
    this->m_data_size = in_EDX;
    memcpy(&this->m_header,ctx,0x50);
    if (((((*(int *)(this->m_header).m_vk_format.m_bytes == 0) &&
          ((((*(int *)(this->m_header).m_type_size.m_bytes == 1 &&
             (iVar9 = *(int *)(this->m_header).m_pixel_width.m_bytes, iVar9 != 0)) &&
            (iVar2 = *(int *)(this->m_header).m_pixel_height.m_bytes, iVar2 != 0)) &&
           (*(int *)(this->m_header).m_pixel_depth.m_bytes == 0)))) &&
         ((uVar3 = *(uint *)(this->m_header).m_face_count.m_bytes, uVar3 == 6 || (uVar3 == 1)))) &&
        ((iVar9 == iVar2 || (uVar3 < 2)))) &&
       ((uVar3 = *(uint *)(this->m_header).m_level_count.m_bytes, 0xffffffef < uVar3 - 0x11 &&
        (uVar4 = *(uint *)(this->m_header).m_supercompression_scheme.m_bytes, uVar4 < 3)))) {
      if (uVar4 == 1) {
        uVar4 = *(uint *)(this->m_header).m_sgd_byte_length.m_bytes;
        if (uVar4 < 0x15) {
          return 0;
        }
        uVar5 = *(uint *)(this->m_header).m_sgd_byte_offset.m_bytes;
        if (uVar5 < 0x50) {
          return 0;
        }
        if (in_EDX < uVar5 + uVar4) {
          return 0;
        }
      }
      bVar7 = basisu::vector<basist::ktx2_level_index>::try_resize
                        (&this->m_levels,(ulong)uVar3,false);
      if (!bVar7) {
        return 0;
      }
      iVar9 = *(int *)(this->m_header).m_level_count.m_bytes;
      uVar12 = (ulong)((iVar9 + (uint)(iVar9 == 0)) * 0x18);
      if (uVar12 + 0x50 <= (ulong)this->m_data_size) {
        if ((this->m_levels).m_size == 0) {
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                        ,0x178,
                        "T &basisu::vector<basist::ktx2_level_index>::operator[](size_t) [T = basist::ktx2_level_index]"
                       );
        }
        memcpy((this->m_levels).m_p,this->m_pData + 0x50,uVar12);
        uVar8 = (this->m_levels).m_size;
        if (uVar8 != 0) {
          iVar9 = *(int *)(this->m_header).m_supercompression_scheme.m_bytes;
          puVar11 = (((this->m_levels).m_p)->m_uncompressed_byte_length).m_bytes + 3;
          do {
            if (*(uint *)(puVar11 + -0x13) < 0x50) {
              return 0;
            }
            if (this->m_data_size < *(uint *)(puVar11 + -0x13) + *(int *)(puVar11 + -0xb)) {
              return 0;
            }
            bVar1 = *puVar11;
            if ((int)((uint)bVar1 << 0x18) < 0) {
              return 0;
            }
            if (iVar9 == 1) {
              if ((puVar11[-2] != 0 ||
                  (((packed_uint<8U> *)(puVar11 + -3))->m_bytes[0] != 0 || puVar11[-1] != 0)) ||
                  bVar1 != 0) {
                return 0;
              }
            }
            else if (((puVar11[-2] == 0 &&
                      (((packed_uint<8U> *)(puVar11 + -3))->m_bytes[0] == 0 && puVar11[-1] == 0)) &&
                      bVar1 == 0) && (iVar9 != 0)) {
              return 0;
            }
            puVar11 = puVar11 + 0x18;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar3 = *(uint *)(this->m_header).m_dfd_byte_length.m_bytes;
        if ((uVar3 | 0x10) == 0x3c) {
          uVar4 = *(uint *)(this->m_header).m_dfd_byte_offset.m_bytes;
          if (uVar4 < 0x50) {
            return 0;
          }
          if (this->m_data_size < uVar4 + uVar3) {
            return 0;
          }
          __src = (int *)(this->m_pData + uVar4);
          bVar7 = basisu::vector<unsigned_char>::try_resize(&this->m_dfd,(ulong)uVar3,false);
          if (!bVar7) {
            return 0;
          }
          memcpy((this->m_dfd).m_p,__src,(ulong)*(uint *)(this->m_header).m_dfd_byte_length.m_bytes)
          ;
          iVar9 = *(int *)(this->m_header).m_dfd_byte_length.m_bytes;
          if ((*__src == iVar9) &&
             ((*(int *)(this->m_header).m_kvd_byte_length.m_bytes == 0 ||
              (*__src == *(int *)(this->m_header).m_kvd_byte_offset.m_bytes -
                         *(int *)(this->m_header).m_dfd_byte_offset.m_bytes)))) {
            bVar1 = *(byte *)((long)(__src + 7) + 3);
            uVar3 = __src[3];
            auVar14 = pmovzxbd(in_XMM1,ZEXT416(uVar3));
            this->m_dfd_color_model = auVar14._0_4_;
            this->m_dfd_color_prims = auVar14._4_4_;
            this->m_dfd_transfer_func = auVar14._8_4_;
            this->m_dfd_flags = auVar14._12_4_;
            if ((uVar3 >> 0x10 & 0xff) - 1 < 2) {
              if ((char)uVar3 == -0x5a) {
                this->m_format = cUASTC4x4;
                this->m_dfd_samples = 1;
                kVar10 = bVar1 & KTX2_DF_CHANNEL_ETC1S_AAA;
                this->m_dfd_chan0 = kVar10;
                this->m_has_alpha = (kVar10 - KTX2_DF_CHANNEL_ETC1S_RRR & 0xfffffffd) == 0;
              }
              else {
                if ((uVar3 & 0xff) != 0xa3) {
                  return 0;
                }
                this->m_format = cETC1S;
                this->m_has_alpha = iVar9 == 0x3c;
                this->m_dfd_samples = (iVar9 == 0x3c) + 1;
                this->m_dfd_chan0 = bVar1 & KTX2_DF_CHANNEL_ETC1S_AAA;
                if (iVar9 == 0x3c) {
                  this->m_dfd_chan1 = *(byte *)((long)(__src + 0xb) + 3) & KTX2_DF_CHANNEL_ETC1S_AAA
                  ;
                }
              }
              bVar7 = read_key_values(this);
              if (bVar7) {
                uVar12 = (ulong)(this->m_key_values).m_size;
                if (uVar12 == 0) {
                  return 1;
                }
                pkVar6 = (this->m_key_values).m_p;
                lVar13 = 0;
                do {
                  iVar9 = strcmp(*(char **)((long)&(pkVar6->m_key).m_p + lVar13),"KTXanimData");
                  if (iVar9 == 0) {
                    this->m_is_video = true;
                    return 1;
                  }
                  lVar13 = lVar13 + 0x20;
                } while (uVar12 << 5 != lVar13);
                return 1;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

bool ktx2_transcoder::init(const void* pData, uint32_t data_size)
	{
		clear();

		if (!pData)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: pData is nullptr\n");
			assert(0);
			return false;
		}

		if (data_size <= sizeof(ktx2_header))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: File is impossibly too small to be a valid KTX2 file\n");
			return false;
		}

		if (memcmp(pData, g_ktx2_file_identifier, sizeof(g_ktx2_file_identifier)) != 0)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: KTX2 file identifier is not present\n");
			return false;
		}

		m_pData = static_cast<const uint8_t *>(pData);
		m_data_size = data_size;

		memcpy((void*)&m_header, pData, sizeof(m_header));

		// We only support UASTC and ETC1S
		if (m_header.m_vk_format != KTX2_VK_FORMAT_UNDEFINED)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: KTX2 file must be in ETC1S or UASTC format\n");
			return false;
		}

		// 3.3: "When format is VK_FORMAT_UNDEFINED, typeSize must equal 1."
		if (m_header.m_type_size != 1)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid type_size\n");
			return false;
		}

		// We only currently support 2D textures (plain, cubemapped, or texture array), which is by far the most common use case.
		// The BasisU library does not support 1D or 3D textures at all.
		if ((m_header.m_pixel_width < 1) || (m_header.m_pixel_height < 1) || (m_header.m_pixel_depth > 0))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Only 2D or cubemap textures are supported\n");
			return false;
		}

		// Face count must be 1 or 6
		if ((m_header.m_face_count != 1) && (m_header.m_face_count != 6))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid face count, file is corrupted or invalid\n");
			return false;
		}

		if (m_header.m_face_count > 1)
		{
			// 3.4: Make sure cubemaps are square.
			if (m_header.m_pixel_width != m_header.m_pixel_height)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Cubemap is not square\n");
				return false;
			}
		}
		
		// 3.7 levelCount: "levelCount=0 is allowed, except for block-compressed formats"
		if (m_header.m_level_count < 1)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level count\n");
			return false;
		}

		// Sanity check the level count.
		if (m_header.m_level_count > KTX2_MAX_SUPPORTED_LEVEL_COUNT)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Too many levels or file is corrupted or invalid\n");
			return false;
		}

		if (m_header.m_supercompression_scheme > KTX2_SS_ZSTANDARD)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid/unsupported supercompression or file is corrupted or invalid\n");
			return false;
		}

		if (m_header.m_supercompression_scheme == KTX2_SS_BASISLZ)
		{
			if (m_header.m_sgd_byte_length <= sizeof(ktx2_etc1s_global_data_header))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Supercompression global data is too small\n");
				return false;
			}

			if (m_header.m_sgd_byte_offset < sizeof(ktx2_header))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Supercompression global data offset is too low\n");
				return false;
			}

			if (m_header.m_sgd_byte_offset + m_header.m_sgd_byte_length > m_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Supercompression global data offset and/or length is too high\n");
				return false;
			}
		}

		if (!m_levels.try_resize(m_header.m_level_count))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Out of memory\n");
			return false;
		}

		const uint32_t level_index_size_in_bytes = basisu::maximum(1U, (uint32_t)m_header.m_level_count) * sizeof(ktx2_level_index);

		if ((sizeof(ktx2_header) + level_index_size_in_bytes) > m_data_size)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: File is too small (can't read level index array)\n");
			return false;
		}

		memcpy((void*)&m_levels[0], m_pData + sizeof(ktx2_header), level_index_size_in_bytes);
		
		// Sanity check the level offsets and byte sizes
		for (uint32_t i = 0; i < m_levels.size(); i++)
		{
			if (m_levels[i].m_byte_offset < sizeof(ktx2_header))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level offset (too low)\n");
				return false;
			}

			if (!m_levels[i].m_byte_length)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level byte length\n");
			}

			if ((m_levels[i].m_byte_offset + m_levels[i].m_byte_length) > m_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level offset and/or length\n");
				return false;
			}
			
			const uint64_t MAX_SANE_LEVEL_UNCOMP_SIZE = 2048ULL * 1024ULL * 1024ULL;
			
			if (m_levels[i].m_uncompressed_byte_length >= MAX_SANE_LEVEL_UNCOMP_SIZE)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid level offset (too large)\n");
				return false;
			}

			if (m_header.m_supercompression_scheme == KTX2_SS_BASISLZ)
			{
				if (m_levels[i].m_uncompressed_byte_length)
				{
					BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid uncompressed length (0)\n");
					return false;
				}
			}
			else if (m_header.m_supercompression_scheme >= KTX2_SS_ZSTANDARD)
			{
				if (!m_levels[i].m_uncompressed_byte_length)
				{
					BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid uncompressed length (1)\n");
					return false;
				}
			}
		}

		const uint32_t DFD_MINIMUM_SIZE = 44, DFD_MAXIMUM_SIZE = 60;
		if ((m_header.m_dfd_byte_length != DFD_MINIMUM_SIZE) && (m_header.m_dfd_byte_length != DFD_MAXIMUM_SIZE))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Unsupported DFD size\n");
			return false;
		}

		if (((m_header.m_dfd_byte_offset + m_header.m_dfd_byte_length) > m_data_size) || (m_header.m_dfd_byte_offset < sizeof(ktx2_header)))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid DFD offset and/or length\n");
			return false;
		}
				
		const uint8_t* pDFD = m_pData + m_header.m_dfd_byte_offset;

		if (!m_dfd.try_resize(m_header.m_dfd_byte_length))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Out of memory\n");
			return false;
		}

		memcpy(m_dfd.data(), pDFD, m_header.m_dfd_byte_length);
		
		// This is all hard coded for only ETC1S and UASTC.
		uint32_t dfd_total_size = basisu::read_le_dword(pDFD);
		
		// 3.10.3: Sanity check
		if (dfd_total_size != m_header.m_dfd_byte_length)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: DFD size validation failed (1)\n");
			return false;
		}
				
		// 3.10.3: More sanity checking
		if (m_header.m_kvd_byte_length)
		{
			if (dfd_total_size != m_header.m_kvd_byte_offset - m_header.m_dfd_byte_offset)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::init: DFD size validation failed (2)\n");
				return false;
			}
		}

		const uint32_t dfd_bits = basisu::read_le_dword(pDFD + 3 * sizeof(uint32_t));
		const uint32_t sample_channel0 = basisu::read_le_dword(pDFD + 7 * sizeof(uint32_t));
		 
		m_dfd_color_model = dfd_bits & 255;
		m_dfd_color_prims = (ktx2_df_color_primaries)((dfd_bits >> 8) & 255);
		m_dfd_transfer_func = (dfd_bits >> 16) & 255;
		m_dfd_flags = (dfd_bits >> 24) & 255;

		// See 3.10.1.Restrictions
		if ((m_dfd_transfer_func != KTX2_KHR_DF_TRANSFER_LINEAR) && (m_dfd_transfer_func != KTX2_KHR_DF_TRANSFER_SRGB))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Invalid DFD transfer function\n");
			return false;
		}

		if (m_dfd_color_model == KTX2_KDF_DF_MODEL_ETC1S)
		{
			m_format = basist::basis_tex_format::cETC1S;
			
			// 3.10.2: "Whether the image has 1 or 2 slices can be determined from the DFD's sample count."
			// If m_has_alpha is true it may be 2-channel RRRG or 4-channel RGBA, but we let the caller deal with that.
			m_has_alpha = (m_header.m_dfd_byte_length == 60);
			
			m_dfd_samples = m_has_alpha ? 2 : 1;
			m_dfd_chan0 = (ktx2_df_channel_id)((sample_channel0 >> 24) & 15);

			if (m_has_alpha)
			{
				const uint32_t sample_channel1 = basisu::read_le_dword(pDFD + 11 * sizeof(uint32_t));
				m_dfd_chan1 = (ktx2_df_channel_id)((sample_channel1 >> 24) & 15);
			}
		}
		else if (m_dfd_color_model == KTX2_KDF_DF_MODEL_UASTC)
		{
			m_format = basist::basis_tex_format::cUASTC4x4;

			m_dfd_samples = 1;
			m_dfd_chan0 = (ktx2_df_channel_id)((sample_channel0 >> 24) & 15);
			
			// We're assuming "DATA" means RGBA so it has alpha.
			m_has_alpha = (m_dfd_chan0 == KTX2_DF_CHANNEL_UASTC_RGBA) || (m_dfd_chan0 == KTX2_DF_CHANNEL_UASTC_RRRG);
		}
		else
		{
			// Unsupported DFD color model.
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: Unsupported DFD color model\n");
			return false;
		}
				
		if (!read_key_values())
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::init: read_key_values() failed\n");
			return false;
		}

		// Check for a KTXanimData key
		for (uint32_t i = 0; i < m_key_values.size(); i++)
		{
			if (strcmp(reinterpret_cast<const char*>(m_key_values[i].m_key.data()), "KTXanimData") == 0)
			{
				m_is_video = true;
				break;
			}
		}

		return true;
	}